

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

Ref<glTF2::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF2::Buffer> *buffer,size_t count,void *data,Value typeIn
          ,Value typeOut,ComponentType compType,bool isIndices)

{
  Value VVar1;
  Buffer *pBVar2;
  BufferView *pBVar3;
  Accessor *pAVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  ulong uVar8;
  void *__dest;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar9;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *p_Var16;
  long lVar17;
  size_t sVar18;
  Ref<glTF2::BufferView> RVar19;
  Ref<glTF2::Accessor> RVar20;
  Ref<glTF2::Accessor> acc;
  string local_70;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  ulong local_40;
  Ref<glTF2::Buffer> *local_38;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar10 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
    uVar13 = 0;
  }
  else {
    uVar7 = *(uint *)(&DAT_0082cbc8 + (ulong)typeIn * 0x10);
    uVar15 = (ulong)*(uint *)(&DAT_0082cbc8 + (ulong)typeOut * 0x10);
    uVar6 = glTF2::ComponentTypeSize(compType);
    local_48 = CONCAT44(extraout_var,uVar6);
    pBVar2 = (buffer->vector->super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>)
             ._M_impl.super__Vector_impl_data._M_start[buffer->index];
    uVar13 = pBVar2->byteLength;
    uVar12 = uVar13 % (ulong)uVar6;
    sVar18 = uVar6 * count * uVar15;
    lVar17 = uVar12 + sVar18;
    local_40 = uVar15;
    local_38 = buffer;
    if (lVar17 != 0) {
      uVar15 = pBVar2->capacity;
      uVar8 = uVar13 + lVar17;
      if (uVar15 < uVar8) {
        uVar15 = (uVar15 >> 1) + uVar15;
        if (uVar15 <= uVar8) {
          uVar15 = uVar8;
        }
        pBVar2->capacity = uVar15;
        __dest = operator_new__(uVar15);
        pvVar14 = (pBVar2->mData).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var16 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar2->mData;
        if (pvVar14 != (void *)0x0) {
          local_50 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar2->mData;
          memcpy(__dest,pvVar14,uVar13);
          p_Var16 = local_50;
        }
        std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
        reset<unsigned_char,std::default_delete<unsigned_char[]>>(p_Var16,__dest);
        uVar8 = lVar17 + pBVar2->byteLength;
      }
      pBVar2->byteLength = uVar8;
    }
    glTF2::Asset::FindUniqueID(&local_70,a,meshName,"view");
    RVar19 = glTF2::LazyDict<glTF2::BufferView>::Create(&a->bufferViews,local_70._M_dataplus._M_p);
    pvVar9 = RVar19.vector;
    uVar6 = RVar19.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pBVar3 = (pvVar9->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)
             ._M_impl.super__Vector_impl_data._M_start[uVar6];
    (pBVar3->buffer).index = local_38->index;
    (pBVar3->buffer).vector = local_38->vector;
    (pvVar9->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->byteOffset = uVar12 + uVar13;
    (pvVar9->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->byteLength = sVar18;
    (pvVar9->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->byteStride = 0;
    (pvVar9->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    glTF2::Asset::FindUniqueID(&local_70,a,meshName,"accessor");
    RVar20 = glTF2::LazyDict<glTF2::Accessor>::Create(&a->accessors,local_70._M_dataplus._M_p);
    pvVar10 = RVar20.vector;
    uVar11 = RVar20.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pAVar4 = (pvVar10->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar11];
    (pAVar4->bufferView).vector = pvVar9;
    (pAVar4->bufferView).index = uVar6;
    (pvVar10->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->byteOffset = 0;
    (pvVar10->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->componentType = compType;
    (pvVar10->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->count = count;
    (pvVar10->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar11]->type = typeOut;
    acc._12_4_ = 0;
    acc.vector = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                 SUB128(RVar20._0_12_,0);
    acc.index = SUB124(RVar20._0_12_,8);
    SetAccessorRange(compType,acc,data,count,uVar7,(uint)local_40);
    pAVar4 = (pvVar10->super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar11];
    lVar17 = *(long *)(*(long *)&(((pAVar4->bufferView).vector)->
                                 super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                 )._M_impl + (ulong)(pAVar4->bufferView).index * 8);
    lVar5 = *(long *)(*(long *)(**(long **)(lVar17 + 0x50) + (ulong)*(uint *)(lVar17 + 0x58) * 8) +
                     0x70);
    VVar1 = pAVar4->type;
    pvVar14 = (void *)(pAVar4->byteOffset + lVar5 + *(long *)(lVar17 + 0x60));
    uVar6 = glTF2::ComponentTypeSize(pAVar4->componentType);
    uVar6 = uVar6 * *(int *)(&DAT_0082cbc8 + (ulong)VVar1 * 0x10);
    uVar13 = (ulong)uVar6;
    lVar17 = *(long *)(*(long *)&(((pAVar4->bufferView).vector)->
                                 super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                 )._M_impl + (ulong)(pAVar4->bufferView).index * 8);
    if ((void *)(lVar5 + *(long *)(*(long *)(**(long **)(lVar17 + 0x50) +
                                            (ulong)*(uint *)(lVar17 + 0x58) * 8) + 0x50)) <
        (void *)(uVar13 * count + (long)pvVar14)) {
      __assert_fail("dst + count*dst_stride <= buffer_ptr + bufferView->buffer->byteLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF2/glTF2Asset.inl"
                    ,0x2a6,"void glTF2::Accessor::WriteData(size_t, const void *, size_t)");
    }
    uVar7 = (int)local_48 * uVar7;
    uVar12 = (ulong)uVar7;
    if (uVar6 == uVar7) {
      memcpy(pvVar14,data,uVar12 * count);
    }
    else {
      uVar15 = uVar12;
      if (uVar13 < uVar12) {
        uVar15 = uVar13;
      }
      do {
        memcpy(pvVar14,data,uVar15);
        if (uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
          memset((void *)(uVar15 + (long)pvVar14),0,uVar13 - uVar15);
        }
        data = (void *)((long)data + uVar12);
        pvVar14 = (void *)((long)pvVar14 + uVar13);
        count = count - 1;
      } while (count != 0);
    }
    uVar13 = (ulong)uVar11;
  }
  RVar20._8_8_ = uVar13;
  RVar20.vector = pvVar10;
  return RVar20;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    size_t count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) {
        return Ref<Accessor>();
    }

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = offset;
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->byteStride = 0;
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
	SetAccessorRange(compType, acc, data, count, numCompsIn, numCompsOut);

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}